

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O2

Memory * LiteScript::Memory::Load(Memory *__return_storage_ptr__,istream *stream)

{
  pointer ppTVar1;
  pointer ppTVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  vector<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_> *pvVar7;
  char *__rhs;
  long lVar8;
  ulong uVar9;
  long lVar10;
  string str;
  
  Memory(__return_storage_ptr__);
  pvVar7 = Type::GetTypesList();
  uVar5 = IStreamer::Read<unsigned_int>(stream);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  uVar9 = 0;
  while ((uint)uVar9 != uVar5) {
    str._M_string_length = 0;
    *str._M_dataplus._M_p = '\0';
    while( true ) {
      cVar3 = std::istream::get();
      if (cVar3 == '\0') break;
      std::__cxx11::string::push_back((char)&str);
    }
    ppTVar1 = (pvVar7->super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    ppTVar2 = (pvVar7->super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    lVar10 = 0;
    lVar8 = 8;
    do {
      if (lVar8 + ((long)ppTVar1 - (long)ppTVar2 & 0x7fffffff8U) == 8) goto LAB_0012c4c9;
      __rhs = Type::GetName(*(Type **)((long)(pvVar7->
                                             super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start + lVar10));
      bVar4 = std::operator==(&str,__rhs);
      lVar8 = lVar8 + -8;
      lVar10 = lVar10 + 8;
    } while (!bVar4);
    std::vector<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>::push_back
              (&__return_storage_ptr__->type_list,
               (value_type *)
               ((long)(pvVar7->
                      super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>).
                      _M_impl.super__Vector_impl_data._M_start - lVar8));
LAB_0012c4c9:
    bVar4 = (long)(__return_storage_ptr__->type_list).
                  super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(__return_storage_ptr__->type_list).
                  super__Vector_base<LiteScript::Type_*,_std::allocator<LiteScript::Type_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3 == uVar9;
    uVar9 = (ulong)((uint)uVar9 + 1);
    if (bVar4) goto LAB_0012c4f4;
  }
  uVar6 = IStreamer::Read<unsigned_int>(stream);
  uVar5 = __return_storage_ptr__->count;
  while (uVar5 < uVar6) {
    LoadVariable(__return_storage_ptr__,stream);
    uVar5 = __return_storage_ptr__->count + 1;
    __return_storage_ptr__->count = uVar5;
  }
LAB_0012c4f4:
  std::__cxx11::string::~string((string *)&str);
  return __return_storage_ptr__;
}

Assistant:

LiteScript::Memory LiteScript::Memory::Load(std::istream &stream) {
    Memory memory;
    const std::vector<Type *>& types = Type::GetTypesList();
    unsigned int sz = IStreamer::Read<unsigned int>(stream);
    std::string str;
    unsigned char c;
    for (unsigned int i = 0; i < sz; i++) {
        str.clear();
        while ((c = (unsigned char)stream.get()) != 0)
            str += c;
        for (unsigned int j = 0, sz_j = types.size(); j < sz_j; j++) {
            if (str == types[j]->GetName()) {
                memory.type_list.push_back(types[j]);
                break;
            }
        }
        if (i == memory.type_list.size())
            return memory;
    }
    sz = IStreamer::Read<unsigned int>(stream);
    for (; memory.count < sz; memory.count++)
        memory.LoadVariable(stream);
    return memory;
}